

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool intersect_skewed_uint16_nonempty(uint16_t *small,size_t size_s,uint16_t *large,size_t size_l)

{
  ushort uVar1;
  long lVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ushort *puVar11;
  
  iVar4 = (int)size_l;
  iVar7 = 0;
  if (size_s == 0) {
    return false;
  }
  uVar3 = *small;
  lVar6 = 0;
  puVar11 = large;
  do {
    uVar1 = *puVar11;
    while (uVar3 <= uVar1) {
      if (uVar1 <= uVar3) {
        return uVar1 <= uVar3;
      }
      if (size_s - 1 == lVar6) {
        return uVar1 <= uVar3;
      }
      lVar2 = lVar6 + 1;
      lVar6 = lVar6 + 1;
      uVar3 = small[lVar2];
    }
    iVar5 = iVar7 + 1;
    iVar9 = iVar5;
    if ((iVar5 < iVar4) && (large[iVar5] < uVar3)) {
      iVar7 = iVar7 + 2;
      iVar10 = 0;
      iVar8 = iVar4 + -1;
      if (iVar7 < iVar4) {
        iVar9 = 1;
        do {
          iVar8 = iVar7;
          iVar10 = iVar9;
          if (uVar3 <= large[iVar7]) break;
          iVar10 = iVar9 * 2;
          iVar7 = iVar5 + iVar9 * 2;
          iVar8 = iVar4 + -1;
          iVar9 = iVar10;
        } while (iVar7 < iVar4);
        iVar10 = iVar10 >> 1;
      }
      iVar9 = iVar8;
      if (((large[iVar8] != uVar3) && (iVar9 = iVar4, uVar3 <= large[iVar8])) &&
         (iVar9 = iVar8, iVar10 + iVar5 + 1 != iVar8)) {
        iVar10 = iVar10 + iVar5;
        do {
          iVar9 = iVar10 + iVar8 >> 1;
          if (large[iVar9] == uVar3) break;
          iVar7 = iVar9;
          if (large[iVar9] < uVar3) {
            iVar7 = iVar8;
            iVar10 = iVar9;
          }
          iVar9 = iVar7;
          iVar8 = iVar7;
        } while (iVar10 + 1 != iVar7);
      }
    }
    iVar7 = iVar9;
    if ((long)iVar7 == size_l) {
      return false;
    }
    puVar11 = large + iVar7;
  } while( true );
}

Assistant:

bool intersect_skewed_uint16_nonempty(const uint16_t *small, size_t size_s,
                                      const uint16_t *large, size_t size_l) {
    size_t idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return false;
    }

    uint16_t val_l = large[idx_l], val_s = small[idx_s];

    while (true) {
        if (val_l < val_s) {
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        } else if (val_s < val_l) {
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
        } else {
            return true;
        }
    }

    return false;
}